

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float fVar1;
  double d;
  bool bVar2;
  string *psVar3;
  ushort *puVar4;
  int iVar5;
  Descriptor *pDVar6;
  Nonnull<const_char_*> pcVar7;
  Nonnull<char_*> pcVar8;
  char *pcVar9;
  EnumValueDescriptor *pEVar10;
  AlphaNum *in_RCX;
  EnumDescriptor *descriptor_00;
  char *pcVar11;
  AlphaNum *c;
  char *in_R9;
  csharp *this_00;
  string_view enum_name;
  string_view enum_value_name;
  LogMessage local_f8;
  undefined1 local_e8 [32];
  string local_c8;
  AlphaNum local_a8;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [48];
  
LAB_00e8c64f:
  switch(descriptor->type_) {
  case '\x01':
    goto switchD_00e8c667_caseD_1;
  case '\x02':
    fVar1 = (descriptor->field_20).default_value_float_;
    if (INFINITY <= fVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "float.PositiveInfinity";
      pcVar9 = "";
      goto LAB_00e8c794;
    }
    if (fVar1 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "float.NegativeInfinity";
      pcVar9 = "";
      goto LAB_00e8c794;
    }
    if (!NAN(fVar1)) {
      local_f8._0_8_ =
           absl::lts_20250127::numbers_internal::SixDigitsToBuffer((double)fVar1,local_e8);
      local_a8.piece_._M_len = 1;
      local_a8.piece_._M_str = "F";
      goto LAB_00e8c754;
    }
LAB_00e8ca3b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "float.NaN";
    pcVar9 = "";
    goto LAB_00e8c794;
  case '\x03':
  case '\x10':
  case '\x12':
    pcVar8 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_int64_t_,local_e8);
    local_f8._0_8_ = (long)pcVar8 - (long)local_e8;
    local_a8.piece_._M_len = 1;
    local_a8.piece_._M_str = "L";
    goto LAB_00e8c754;
  case '\x04':
  case '\x06':
    pcVar8 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_uint64_t_,local_e8);
    local_f8._0_8_ = (long)pcVar8 - (long)local_e8;
    local_a8.piece_._M_len = 2;
    local_a8.piece_._M_str = "UL";
    goto LAB_00e8c754;
  case '\x05':
  case '\x0f':
  case '\x11':
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_int32_t_,local_e8);
    break;
  case '\a':
  case '\r':
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_uint32_t_,local_e8);
    break;
  case '\b':
    bVar2 = (descriptor->field_20).default_value_bool_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar2 == true) {
      pcVar11 = "true";
      pcVar9 = "";
    }
    else {
      pcVar11 = "false";
      pcVar9 = "";
    }
    goto LAB_00e8c794;
  case '\t':
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\n':
switchD_00e8c667_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "null";
    pcVar9 = "";
    goto LAB_00e8c794;
  case '\v':
    pDVar6 = FieldDescriptor::message_type(descriptor);
    psVar3 = pDVar6->file_->name_;
    if ((psVar3->_M_string_length != 0x1e) ||
       (iVar5 = bcmp((psVar3->_M_dataplus)._M_p,"google/protobuf/wrappers.proto",0x1e), iVar5 != 0))
    goto switchD_00e8c667_caseD_a;
    pDVar6 = FieldDescriptor::message_type(descriptor);
    this = (FieldGeneratorBase *)(long)pDVar6->field_count_;
    if ((long)this < 1) {
      pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)this,"index < field_count()");
    }
    else {
      pcVar7 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar7 != (Nonnull<const_char_*>)0x0) {
      default_value_abi_cxx11_();
      goto LAB_00e8ca3b;
    }
    descriptor = pDVar6->fields_;
    goto LAB_00e8c64f;
  case '\f':
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\x0e':
    pEVar10 = FieldDescriptor::default_value_enum(descriptor);
    GetClassName_abi_cxx11_((string *)local_78,(csharp *)pEVar10->type_,descriptor_00);
    local_f8._0_8_ = local_78._8_8_;
    local_f8.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_78._0_8_;
    local_a8.piece_._M_len = 1;
    local_a8.piece_._M_str = ".";
    pEVar10 = FieldDescriptor::default_value_enum(descriptor);
    puVar4 = (ushort *)(pEVar10->type_->all_names_).payload_;
    this_00 = (csharp *)(ulong)*puVar4;
    pEVar10 = FieldDescriptor::default_value_enum(descriptor);
    c = (AlphaNum *)(pEVar10->all_names_->_M_dataplus)._M_p;
    enum_name._M_str = (char *)pEVar10->all_names_->_M_string_length;
    enum_name._M_len = (long)puVar4 + ~(ulong)this_00;
    enum_value_name._M_str = in_R9;
    enum_value_name._M_len = (size_t)c;
    GetEnumValueName_abi_cxx11_(&local_c8,this_00,enum_name,enum_value_name);
    local_58._0_8_ = local_c8._M_string_length;
    local_58._8_8_ = local_c8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_f8,&local_a8,(AlphaNum *)local_58,c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((LogMessageData *)local_78._0_8_ == (LogMessageData *)(local_78 + 0x10)) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x195);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_f8,(char (*) [20])"Unknown field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f8);
  }
  pcVar11 = local_e8;
  local_f8._0_8_ = (long)pcVar9 - (long)pcVar11;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_f8.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )pcVar11;
  goto LAB_00e8c794;
switchD_00e8c667_caseD_1:
  d = (descriptor->field_20).default_value_double_;
  if (d < INFINITY) {
    if (-INFINITY < d) {
      if (!NAN(d)) {
        local_f8._0_8_ = absl::lts_20250127::numbers_internal::SixDigitsToBuffer(d,local_e8);
        local_a8.piece_._M_len = 1;
        local_a8.piece_._M_str = "D";
LAB_00e8c754:
        local_f8.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )local_e8;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_f8,&local_a8,in_RCX);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "double.NaN";
      pcVar9 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "double.NegativeInfinity";
      pcVar9 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "double.PositiveInfinity";
    pcVar9 = "";
  }
LAB_00e8c794:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return absl::StrCat(
          GetClassName(descriptor->default_value_enum()->type()), ".",
          GetEnumValueName(descriptor->default_value_enum()->type()->name(),
                           descriptor->default_value_enum()->name()));
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return absl::StrCat(value, "D");
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return absl::StrCat(value, "F");
    }
    case FieldDescriptor::TYPE_INT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_UINT64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_INT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_FIXED32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_SINT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}